

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O2

UChar * __thiscall
icu_63::BMPSet::span(BMPSet *this,UChar *s,UChar *limit,USetSpanCondition spanCondition)

{
  UChar UVar1;
  char cVar2;
  uint uVar3;
  int32_t iVar4;
  int32_t iVar5;
  UChar *pUVar6;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    do {
      UVar1 = *s;
      pUVar6 = s;
      if ((ushort)UVar1 < 0x100) {
        cVar2 = this->latin1Contains[(ushort)UVar1];
joined_r0x001bb54e:
        if (cVar2 != '\0') {
          return s;
        }
      }
      else {
        if (0x7ff < (ushort)UVar1) {
          if ((ushort)(UVar1 + L'\x2000') < 0xf800) {
            uVar3 = *(uint *)((long)this->bmpBlockBits + (ulong)((ushort)UVar1 >> 4 & 0xfc)) >>
                    (byte)((ushort)UVar1 >> 0xc) & 0x10001;
            if (uVar3 < 2) {
              if (uVar3 != 0) {
                return s;
              }
              goto LAB_001bb550;
            }
            iVar5 = this->list4kStarts[(ushort)UVar1 >> 0xc];
            iVar4 = this->list4kStarts[(ulong)((ushort)UVar1 >> 0xc) + 1];
          }
          else {
            if ((((ushort)UVar1 < 0xdc00) && (pUVar6 = s + 1, pUVar6 != limit)) &&
               (0xfbff < (ushort)(*pUVar6 + L'\x2000'))) {
              cVar2 = containsSlow(this,(uint)(ushort)UVar1 * 0x400 + (uint)(ushort)*pUVar6 +
                                        -0x35fdc00,this->list4kStarts[0x10],this->list4kStarts[0x11]
                                  );
              goto joined_r0x001bb54e;
            }
            iVar5 = this->list4kStarts[0xd];
            iVar4 = this->list4kStarts[0xe];
          }
          cVar2 = containsSlow(this,(uint)(ushort)UVar1,iVar5,iVar4);
          pUVar6 = s;
          goto joined_r0x001bb54e;
        }
        if ((this->table7FF[(ushort)UVar1 & 0x3f] >> ((ushort)UVar1 >> 6 & 0x1f) & 1) != 0) {
          return s;
        }
      }
LAB_001bb550:
      s = pUVar6 + 1;
    } while (s < limit);
  }
  else {
    do {
      UVar1 = *s;
      pUVar6 = s;
      if ((ushort)UVar1 < 0x100) {
        cVar2 = this->latin1Contains[(ushort)UVar1];
joined_r0x001bb415:
        if (cVar2 == '\0') {
          return s;
        }
      }
      else {
        if (0x7ff < (ushort)UVar1) {
          if ((ushort)(UVar1 + L'\x2000') < 0xf800) {
            uVar3 = *(uint *)((long)this->bmpBlockBits + (ulong)((ushort)UVar1 >> 4 & 0xfc)) >>
                    (byte)((ushort)UVar1 >> 0xc) & 0x10001;
            if (uVar3 < 2) {
              if (uVar3 == 0) {
                return s;
              }
              goto LAB_001bb41b;
            }
            iVar5 = this->list4kStarts[(ushort)UVar1 >> 0xc];
            iVar4 = this->list4kStarts[(ulong)((ushort)UVar1 >> 0xc) + 1];
          }
          else {
            if ((((ushort)UVar1 < 0xdc00) && (pUVar6 = s + 1, pUVar6 != limit)) &&
               (0xfbff < (ushort)(*pUVar6 + L'\x2000'))) {
              cVar2 = containsSlow(this,(uint)(ushort)UVar1 * 0x400 + (uint)(ushort)*pUVar6 +
                                        -0x35fdc00,this->list4kStarts[0x10],this->list4kStarts[0x11]
                                  );
              goto joined_r0x001bb415;
            }
            iVar5 = this->list4kStarts[0xd];
            iVar4 = this->list4kStarts[0xe];
          }
          cVar2 = containsSlow(this,(uint)(ushort)UVar1,iVar5,iVar4);
          pUVar6 = s;
          goto joined_r0x001bb415;
        }
        if ((this->table7FF[(ushort)UVar1 & 0x3f] >> ((ushort)UVar1 >> 6 & 0x1f) & 1) == 0) {
          return s;
        }
      }
LAB_001bb41b:
      s = pUVar6 + 1;
    } while (s < limit);
  }
  return s;
}

Assistant:

const UChar *
BMPSet::span(const UChar *s, const UChar *limit, USetSpanCondition spanCondition) const {
    UChar c, c2;

    if(spanCondition) {
        // span
        do {
            c=*s;
            if(c<=0xff) {
                if(!latin1Contains[c]) {
                    break;
                }
            } else if(c<=0x7ff) {
                if((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))==0) {
                    break;
                }
            } else if(c<0xd800 || c>=0xe000) {
                int lead=c>>12;
                uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
                if(twoBits<=1) {
                    // All 64 code points with the same bits 15..6
                    // are either in the set or not.
                    if(twoBits==0) {
                        break;
                    }
                } else {
                    // Look up the code point in its 4k block of code points.
                    if(!containsSlow(c, list4kStarts[lead], list4kStarts[lead+1])) {
                        break;
                    }
                }
            } else if(c>=0xdc00 || (s+1)==limit || (c2=s[1])<0xdc00 || c2>=0xe000) {
                // surrogate code point
                if(!containsSlow(c, list4kStarts[0xd], list4kStarts[0xe])) {
                    break;
                }
            } else {
                // surrogate pair
                if(!containsSlow(U16_GET_SUPPLEMENTARY(c, c2), list4kStarts[0x10], list4kStarts[0x11])) {
                    break;
                }
                ++s;
            }
        } while(++s<limit);
    } else {
        // span not
        do {
            c=*s;
            if(c<=0xff) {
                if(latin1Contains[c]) {
                    break;
                }
            } else if(c<=0x7ff) {
                if((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))!=0) {
                    break;
                }
            } else if(c<0xd800 || c>=0xe000) {
                int lead=c>>12;
                uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
                if(twoBits<=1) {
                    // All 64 code points with the same bits 15..6
                    // are either in the set or not.
                    if(twoBits!=0) {
                        break;
                    }
                } else {
                    // Look up the code point in its 4k block of code points.
                    if(containsSlow(c, list4kStarts[lead], list4kStarts[lead+1])) {
                        break;
                    }
                }
            } else if(c>=0xdc00 || (s+1)==limit || (c2=s[1])<0xdc00 || c2>=0xe000) {
                // surrogate code point
                if(containsSlow(c, list4kStarts[0xd], list4kStarts[0xe])) {
                    break;
                }
            } else {
                // surrogate pair
                if(containsSlow(U16_GET_SUPPLEMENTARY(c, c2), list4kStarts[0x10], list4kStarts[0x11])) {
                    break;
                }
                ++s;
            }
        } while(++s<limit);
    }
    return s;
}